

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum.hpp
# Opt level: O0

void __thiscall
ranges::
partial_sum_view<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_std::plus<void>_>
::cursor<false>::cursor(cursor<false> *this,Parent *rng)

{
  bool bVar1;
  const_reference_t piVar2;
  _result_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
  local_30;
  Parent *local_18;
  Parent *rng_local;
  cursor<false> *this_local;
  
  this->parent_ = rng;
  local_18 = rng;
  rng_local = (Parent *)this;
  _begin_::fn::
  operator()<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
            (&this->current_,(fn *)&_::begin,&rng->base_);
  _end_::fn::
  operator()<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
            (&local_30,(fn *)&_::end,&local_18->base_);
  bVar1 = operator!=<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                    (&this->current_,&local_30);
  if (bVar1) {
    piVar2 = basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
             ::operator*(&this->current_);
    this->sum_ = *piVar2;
  }
  return;
}

Assistant:

constexpr explicit cursor(Parent * rng)
              : parent_{rng}
              , current_(ranges::begin(rng->base_))
            {
                if(current_ != ranges::end(rng->base_))
                    sum_ = *current_;
            }